

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCRgba.cpp
# Opt level: O1

void anon_unknown.dwarf_2d984e::writeReadCRGBA
               (char *fileName,int width,int height,Array2D<ImfRgba> *p1,RgbaChannels channels,
               LineOrder lorder,Compression comp)

{
  ImfRgba *pIVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *this;
  long *plVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ImfRgba *pIVar8;
  long lVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  Array2D<ImfRgba> *ImfRgbaPixels;
  char *pcVar11;
  ulong uVar12;
  ImfRgba *pIVar13;
  ulong uVar14;
  long lVar15;
  ImfHalf *pIVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  Array2D<Imf_3_4::Rgba> p2_temp;
  Array2D<Imf_3_4::Rgba> p1_temp;
  float yScreenWindowCenter;
  float xScreenWindowCenter;
  int yMaxDisplayWindow;
  int xMaxDisplayWindow;
  int yMinDisplayWindow;
  int xMinDisplayWindow;
  int yMaxDataWindow;
  int xMaxDataWindow;
  int yMinDataWindow;
  int xMinDataWindow;
  int yMax;
  int yMin;
  float yScreenWindowCenterOut;
  float xScreenWindowCenterOut;
  Array2D<ImfRgba> p2;
  int xMax;
  int xMin;
  int local_108;
  Array2D<Imf_3_4::Rgba> local_100;
  Array2D<Imf_3_4::Rgba> local_e8;
  long local_d0;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  float local_b8;
  float local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  float local_88;
  float local_84;
  ulong local_80;
  long local_78;
  long local_70;
  char *local_68;
  Array2D<ImfRgba> local_60;
  long local_48;
  ulong local_40;
  int local_38;
  int local_34;
  
  ImfRgbaPixels = (Array2D<ImfRgba> *)CONCAT44(in_register_00000034,width);
  local_68 = fileName;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"channels ",9);
  local_40 = (ulong)(height & 1U);
  pcVar11 = "R";
  if ((height & 1U) == 0) {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar11,local_40);
  local_bc = height & 2;
  pcVar11 = "G";
  if (local_bc == 0) {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar11,(ulong)(local_bc >> 1));
  local_c0 = height & 4;
  pcVar11 = "B";
  if (local_c0 == 0) {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar11,(ulong)(local_c0 >> 2));
  local_c4 = height & 8;
  pcVar11 = "A";
  if (local_c4 == 0) {
    pcVar11 = "";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar11,(ulong)(local_c4 >> 3));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", line order ",0xd);
  this = (ostream *)std::ostream::operator<<(&std::cout,(int)p1);
  std::__ostream_insert<char,std::char_traits<char>>(this,", compression ",0xe);
  plVar5 = (long *)std::ostream::operator<<(this,channels);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  uVar6 = ImfNewHeader();
  pcVar11 = local_68;
  ImfHeaderSetLineOrder(uVar6,(ulong)p1 & 0xffffffff);
  ImfHeaderSetCompression(uVar6,channels);
  ImfHeaderSetDataWindow(uVar6,0,0,0xec,0x76);
  ImfHeaderSetDisplayWindow(uVar6,0,0,0xec,0x76);
  ImfHeaderScreenWindowCenter(uVar6,&local_84,&local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing ",8);
  std::ostream::flush();
  remove(pcVar11);
  uVar7 = ImfOpenOutputFile(pcVar11,uVar6,height);
  ImfOutputSetFrameBuffer(uVar7,ImfRgbaPixels->_data,1,0xed);
  ImfOutputWritePixels(uVar7,0x77);
  iVar2 = ImfCloseOutputFile(uVar7);
  if (iVar2 != 1) {
    __assert_fail("outputFileClosed == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x6e,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading ",8);
  std::ostream::flush();
  local_70 = ImfOpenInputFile(pcVar11);
  if (local_70 == 0) {
    __assert_fail("in != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x76,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  uVar7 = ImfInputHeader(local_70);
  ImfHeaderDataWindow(uVar7,&local_34,&local_8c,&local_38,&local_90);
  iVar2 = local_90;
  lVar9 = (long)local_38 - (long)local_34;
  uVar10 = lVar9 + 1;
  local_d0 = (long)local_8c;
  lVar17 = local_90 - local_d0;
  local_78 = lVar17 + 1;
  local_80 = -(ulong)(local_78 * uVar10 >> 0x3d != 0) | local_78 * uVar10 * 8;
  local_60._sizeX = local_78;
  local_60._sizeY = uVar10;
  pIVar8 = (ImfRgba *)operator_new__(local_80);
  lVar15 = local_70;
  local_108 = (int)lVar9;
  if (-1 < (int)lVar17) {
    uVar12 = 0;
    pIVar13 = pIVar8;
    do {
      if (-1 < local_108) {
        uVar14 = 0;
        do {
          pIVar1 = pIVar13 + uVar14;
          pIVar1->r = 0;
          pIVar1->g = 0;
          pIVar1->b = 0;
          pIVar1->a = 1;
          uVar14 = uVar14 + 1;
        } while ((uVar10 & 0xffffffff) != uVar14);
      }
      uVar12 = uVar12 + 1;
      pIVar13 = pIVar13 + uVar10;
    } while (uVar12 != (iVar2 - (int)local_d0) + 1);
  }
  local_60._data = pIVar8;
  local_48 = lVar17;
  iVar3 = ImfInputSetFrameBuffer(local_70,pIVar8 + (-local_d0 * uVar10 - (long)local_34),1);
  if (iVar3 != 1) {
    __assert_fail("successSetFrameBuffer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x89,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar3 = ImfInputReadPixels(lVar15,local_8c,local_90);
  if (iVar3 != 1) {
    __assert_fail("successReadPixels == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  ImfHeaderDataWindow(uVar7,&local_94,&local_98,&local_9c,&local_a0);
  ImfHeaderDisplayWindow(uVar7,&local_a4,&local_a8,&local_ac,&local_b0);
  ImfHeaderScreenWindowCenter(uVar7,&local_b4,&local_b8);
  if ((((local_a4 != 0) || (local_a8 != 0)) || (local_ac != 0xec)) || (local_b0 != 0x76)) {
    __assert_fail("(xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9a,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  if (((local_94 != 0) || (local_98 != 0)) || ((local_9c != 0xec || (local_a0 != 0x76)))) {
    __assert_fail("(xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9c,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar18 = (float)ImfHeaderPixelAspectRatio(uVar7);
  fVar19 = (float)ImfHeaderPixelAspectRatio(uVar6);
  if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
    __assert_fail("ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0x9e,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  if ((((local_b4 != local_84) || (NAN(local_b4) || NAN(local_84))) || (local_b8 != local_88)) ||
     (NAN(local_b8) || NAN(local_88))) {
    __assert_fail("(xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa0,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar18 = (float)ImfHeaderScreenWindowWidth(uVar7);
  fVar19 = (float)ImfHeaderScreenWindowWidth(uVar6);
  if ((fVar18 != fVar19) || (NAN(fVar18) || NAN(fVar19))) {
    __assert_fail("ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa2,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar3 = ImfHeaderLineOrder(uVar7);
  iVar4 = ImfHeaderLineOrder(uVar6);
  if (iVar3 != iVar4) {
    __assert_fail("ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa4,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar3 = ImfHeaderCompression(uVar7);
  iVar4 = ImfHeaderCompression(uVar6);
  if (iVar3 != iVar4) {
    __assert_fail("ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa6,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar3 = ImfInputChannels(lVar15);
  if (iVar3 != height) {
    __assert_fail("ImfInputChannels (in) == channels",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xa8,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  iVar3 = ImfHeaderCompression(uVar7);
  iVar4 = (int)uVar10;
  if ((iVar3 == 6) || (iVar3 = ImfHeaderCompression(uVar7), iVar3 == 7)) {
    lVar15 = local_78;
    uVar12 = local_80;
    local_e8._sizeX = local_78;
    local_e8._sizeY = uVar10;
    local_e8._data = (Rgba *)operator_new__(local_80);
    local_100._sizeX = lVar15;
    local_100._sizeY = uVar10;
    local_100._data = (Rgba *)operator_new__(uVar12);
    iVar2 = (int)lVar15;
    convertImfRgbaToRgbaPixels(ImfRgbaPixels,&local_e8,iVar4,iVar2);
    convertImfRgbaToRgbaPixels(&local_60,&local_100,iVar4,iVar2);
    compareB44(0xed,0x77,&local_e8,&local_100,height);
  }
  else {
    iVar3 = ImfHeaderCompression(uVar7);
    if ((iVar3 != 8) && (iVar3 = ImfHeaderCompression(uVar7), iVar3 != 9)) {
      if (-1 < (int)local_48) {
        iVar2 = iVar2 - (int)local_d0;
        pIVar16 = &pIVar8->a;
        lVar15 = 0;
        uVar12 = 0;
        do {
          if (-1 < local_108) {
            uVar14 = 0;
            do {
              if ((int)local_40 == 0) {
                fVar18 = (float)ImfHalfToFloat(pIVar16[uVar14 * 4 + -3]);
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].r) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xc6,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else if (pIVar16[uVar14 * 4 + -3] !=
                       *(ImfHalf *)
                        ((long)&ImfRgbaPixels->_data[uVar14].r + ImfRgbaPixels->_sizeY * lVar15)) {
                __assert_fail("p2[y][x].r == p1[y][x].r",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                              ,0xc4,
                              "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
              if (local_bc == 0) {
                fVar18 = (float)ImfHalfToFloat(pIVar16[uVar14 * 4 + -2]);
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].g) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xcb,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else if (pIVar16[uVar14 * 4 + -2] !=
                       *(ImfHalf *)
                        ((long)&ImfRgbaPixels->_data[uVar14].g + ImfRgbaPixels->_sizeY * lVar15)) {
                __assert_fail("p2[y][x].g == p1[y][x].g",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                              ,0xc9,
                              "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
              if (local_c0 == 0) {
                fVar18 = (float)ImfHalfToFloat(pIVar16[uVar14 * 4 + -1]);
                if ((fVar18 != 0.0) || (NAN(fVar18))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].b) == 0.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xd0,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else if (pIVar16[uVar14 * 4 + -1] !=
                       *(ImfHalf *)
                        ((long)&ImfRgbaPixels->_data[uVar14].b + ImfRgbaPixels->_sizeY * lVar15)) {
                __assert_fail("p2[y][x].b == p1[y][x].b",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                              ,0xce,
                              "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
              if (local_c4 == 0) {
                fVar18 = (float)ImfHalfToFloat(pIVar16[uVar14 * 4]);
                if ((fVar18 != 1.0) || (NAN(fVar18))) {
                  __assert_fail("ImfHalfToFloat(p2[y][x].a) == 1.0",
                                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                                ,0xd5,
                                "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else if (pIVar16[uVar14 * 4] !=
                       *(ImfHalf *)
                        ((long)&ImfRgbaPixels->_data[uVar14].a + ImfRgbaPixels->_sizeY * lVar15)) {
                __assert_fail("p2[y][x].a == p1[y][x].a",
                              "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                              ,0xd3,
                              "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                             );
              }
              uVar14 = uVar14 + 1;
            } while ((uVar10 & 0xffffffff) != uVar14);
          }
          uVar12 = uVar12 + 1;
          pIVar16 = pIVar16 + uVar10 * 4;
          lVar15 = lVar15 + 8;
        } while (uVar12 != iVar2 + 1);
      }
      goto LAB_001955cd;
    }
    lVar15 = local_78;
    uVar12 = local_80;
    local_e8._sizeX = local_78;
    local_e8._sizeY = uVar10;
    local_e8._data = (Rgba *)operator_new__(local_80);
    local_100._sizeX = lVar15;
    local_100._sizeY = uVar10;
    local_100._data = (Rgba *)operator_new__(uVar12);
    iVar2 = (int)lVar15;
    convertImfRgbaToRgbaPixels(ImfRgbaPixels,&local_e8,iVar4,iVar2);
    convertImfRgbaToRgbaPixels(&local_60,&local_100,iVar4,iVar2);
    compareDwa(0xed,0x77,&local_e8,&local_100,height);
  }
  if (local_100._data != (Rgba *)0x0) {
    operator_delete__(local_100._data);
  }
  if (local_e8._data != (Rgba *)0x0) {
    operator_delete__(local_e8._data);
  }
LAB_001955cd:
  iVar2 = ImfCloseInputFile(local_70);
  pcVar11 = local_68;
  if (iVar2 != 1) {
    __assert_fail("inputFileClosed == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testCRgba.cpp"
                  ,0xdb,
                  "void (anonymous namespace)::writeReadCRGBA(const char *, int, int, const Array2D<ImfRgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  if (local_60._data != (ImfRgba *)0x0) {
    operator_delete__(local_60._data);
  }
  ImfDeleteHeader(uVar6);
  remove(pcVar11);
  return;
}

Assistant:

void
writeReadCRGBA (
    const char           fileName[],
    int                  width,
    int                  height,
    const Array2D<ImfRgba>& p1,
    RgbaChannels         channels,
    LineOrder            lorder,
    Compression          comp)
{
    // 
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the original.
    //

    cout << "channels " << ((channels & IMF_WRITE_R) ? "R" : "")
         << ((channels & IMF_WRITE_G) ? "G" : "")
         << ((channels & IMF_WRITE_B) ? "B" : "")
         << ((channels & IMF_WRITE_A) ? "A" : "") << ", line order " << lorder
         << ", compression " << comp << endl;

    ImfHeader* headerPtr = ImfNewHeader ();
    ImfHeaderSetLineOrder (headerPtr, lorder);
    ImfHeaderSetCompression (headerPtr, comp);
    ImfHeaderSetDataWindow (headerPtr, 0, 0, width - 1, height - 1);
    ImfHeaderSetDisplayWindow (headerPtr, 0, 0, width - 1, height - 1);

    // Get screenWindowCenter for comparison
    float xScreenWindowCenterOut, yScreenWindowCenterOut;
    ImfHeaderScreenWindowCenter (headerPtr, &xScreenWindowCenterOut, &yScreenWindowCenterOut);

    cout << "writing ";
    cout.flush ();

    {
        remove (fileName);
        ImfOutputFile* out = ImfOpenOutputFile (fileName, headerPtr, channels);
        ImfOutputSetFrameBuffer (out, &p1[0][0], 1, width);
        ImfOutputWritePixels (out, height);
        int outputFileClosed = ImfCloseOutputFile (out);
        assert (outputFileClosed == 1);
    }

    cout << "reading ";
    cout.flush ();

    {
        ImfInputFile* in = ImfOpenInputFile (fileName);
        assert (in != NULL);
        const ImfHeader* inputFileHeaderPtr = ImfInputHeader (in);
        int xMin, yMin, xMax, yMax;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMin, &yMin, &xMax, &yMax);

        int w  = xMax - xMin + 1;
        int h  = yMax - yMin + 1;
        int dx = xMin;
        int dy = yMin;

        Array2D<ImfRgba> p2 (h, w);
        for (int y = 0; y < h; ++y)
        {
            for (int x = 0; x < w; ++x)
            {
                p2[y][x] = {0, 0, 0, 1};
            }
        }
        int successSetFrameBuffer = ImfInputSetFrameBuffer (in, &p2[-dy][-dx], 1, w);
        assert (successSetFrameBuffer == 1);
        int successReadPixels = ImfInputReadPixels (in, yMin, yMax);
        assert (successReadPixels == 1);

        // Get inputFile dataWindow
        int xMinDataWindow, yMinDataWindow, xMaxDataWindow, yMaxDataWindow;
        ImfHeaderDataWindow (inputFileHeaderPtr, &xMinDataWindow, &yMinDataWindow, &xMaxDataWindow, &yMaxDataWindow);

        // Get inputFile displayWindow
        int xMinDisplayWindow, yMinDisplayWindow, xMaxDisplayWindow, yMaxDisplayWindow;
        ImfHeaderDisplayWindow (inputFileHeaderPtr, &xMinDisplayWindow, &yMinDisplayWindow, &xMaxDisplayWindow, &yMaxDisplayWindow);

        // Get inputFile screenWindowCenter
        float xScreenWindowCenter, yScreenWindowCenter;
        ImfHeaderScreenWindowCenter (inputFileHeaderPtr, &xScreenWindowCenter, &yScreenWindowCenter);

        // Compare displayWindow
        assert ((xMinDisplayWindow == 0) && (yMinDisplayWindow == 0) && (xMaxDisplayWindow == width - 1) && (yMaxDisplayWindow == height - 1));
        // Compare dataWindow
        assert ((xMinDataWindow == 0) && (yMinDataWindow == 0) && (xMaxDataWindow == width - 1) && (yMaxDataWindow == height - 1));
        // Compare pixelAspectRatio
        assert (ImfHeaderPixelAspectRatio(inputFileHeaderPtr) == ImfHeaderPixelAspectRatio (headerPtr));
        // Compare screenWindowCenter
        assert ((xScreenWindowCenter == xScreenWindowCenterOut) && (yScreenWindowCenter == yScreenWindowCenterOut));
        // Compare screenWindowWidth
        assert (ImfHeaderScreenWindowWidth (inputFileHeaderPtr) == ImfHeaderScreenWindowWidth (headerPtr));
        // Compare lineOrder
        assert (ImfHeaderLineOrder (inputFileHeaderPtr) == ImfHeaderLineOrder (headerPtr));
        // Compare compression
        assert (ImfHeaderCompression (inputFileHeaderPtr) == ImfHeaderCompression (headerPtr));
        // Compare channels
        assert(ImfInputChannels (in) == channels);

        if (ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44_COMPRESSION ||
            ImfHeaderCompression(inputFileHeaderPtr) == IMF_B44A_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h,w);
            Array2D<Rgba> p2_temp (h,w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareB44 (width, height, p1_temp, p2_temp, channels);
        }
        else if (
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAA_COMPRESSION ||
            ImfHeaderCompression (inputFileHeaderPtr) == IMF_DWAB_COMPRESSION)
        {
            Array2D<Rgba> p1_temp (h, w);
            Array2D<Rgba> p2_temp (h, w);
            convertImfRgbaToRgbaPixels (p1, p1_temp, w, h);
            convertImfRgbaToRgbaPixels (p2, p2_temp, w, h);
            compareDwa (width, height, p1_temp, p2_temp, channels);
        }
        else
        {
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < w; ++x)
                {  
                    if (channels & IMF_WRITE_R)
                        assert (p2[y][x].r == p1[y][x].r);
                    else
                        assert (ImfHalfToFloat(p2[y][x].r) == 0.0);

                    if (channels & IMF_WRITE_G)
                        assert (p2[y][x].g == p1[y][x].g);
                    else
                        assert (ImfHalfToFloat(p2[y][x].g) == 0.0);

                    if (channels & IMF_WRITE_B)
                        assert (p2[y][x].b == p1[y][x].b);
                    else
                        assert (ImfHalfToFloat(p2[y][x].b) == 0.0);

                    if (channels & IMF_WRITE_A) 
                        assert (p2[y][x].a == p1[y][x].a);
                    else
                        assert (ImfHalfToFloat(p2[y][x].a) == 1.0);       
                }
            }
        }

        int inputFileClosed = ImfCloseInputFile (in);
        assert (inputFileClosed == 1);
    }
    ImfDeleteHeader(headerPtr);
    remove (fileName);
}